

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O1

Expr product_builtin(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                    Expr *args,int argc)

{
  ValueType VVar1;
  Expr *__ptr;
  long lVar3;
  Expr EVar4;
  Expr EVar5;
  Expr a;
  anon_union_8_8_707b72ea_for_Expr_1 aVar2;
  
  if (argc == 0) {
    EVar4 = make_int_one(exec);
    aVar2 = EVar4.field_1;
    VVar1 = EVar4.type;
  }
  else {
    __ptr = exec_eval_each(exec,callContext,args,argc);
    VVar1 = __ptr->type;
    aVar2 = (anon_union_8_8_707b72ea_for_Expr_1)(__ptr->field_1).val_atom;
    if (1 < argc) {
      lVar3 = 0;
      do {
        EVar4._4_4_ = 0;
        EVar4.type = *(uint *)((long)&__ptr[1].type + lVar3);
        a._4_4_ = 0;
        a.type = VVar1;
        EVar4.field_1.val_atom =
             ((anon_union_8_8_707b72ea_for_Expr_1 *)((long)&__ptr[1].field_1 + lVar3))->val_atom;
        a.field_1.val_atom = aVar2.val_atom;
        EVar4 = exec_product(exec,a,EVar4);
        aVar2 = EVar4.field_1;
        VVar1 = EVar4.type;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)argc * 0x10 + -0x10 != lVar3);
    }
    free(__ptr);
  }
  EVar5._4_4_ = 0;
  EVar5.type = VVar1;
  EVar5.field_1.val_atom = aVar2.val_atom;
  return EVar5;
}

Assistant:

BUILTIN_FUNC(product_builtin)
{
    if (argc == 0)
        return make_int_one(exec);

    Expr *values = exec_eval_each(exec, callContext, args, argc);

    Expr num = values[0];
    for (int i = 1; i < argc; i++)
        num = exec_product(exec, num, values[i]);

    free(values);
    return num;
}